

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# asmcode.cpp
# Opt level: O0

opcode_table * assembler::anon_unknown_0::make_movsd_table(void)

{
  opcode_table *in_RDI;
  allocator<char> local_f1;
  string local_f0;
  opcode local_d0;
  allocator<char> local_79;
  string local_78;
  opcode local_58;
  undefined1 local_11;
  opcode_table *t;
  
  local_11 = 0;
  opcode_table::opcode_table(in_RDI);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_78,"MOVSD",&local_79);
  make_opcode(&local_58,0xf2,&local_78,2,'\x0f','\x10',xmm,xmm_m64);
  opcode_table::add_opcode(in_RDI,&local_58);
  opcode::~opcode(&local_58);
  std::__cxx11::string::~string((string *)&local_78);
  std::allocator<char>::~allocator(&local_79);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_f0,"MOVSD",&local_f1);
  make_opcode(&local_d0,0xf2,&local_f0,2,'\x0f','\x11',xmm_m64,xmm);
  opcode_table::add_opcode(in_RDI,&local_d0);
  opcode::~opcode(&local_d0);
  std::__cxx11::string::~string((string *)&local_f0);
  std::allocator<char>::~allocator(&local_f1);
  return in_RDI;
}

Assistant:

opcode_table make_movsd_table()
    {
    opcode_table t;
    t.add_opcode(make_opcode(0xf2, "MOVSD", opcode::r, 0x0f, 0x10, opcode::xmm, opcode::xmm_m64));
    t.add_opcode(make_opcode(0xf2, "MOVSD", opcode::r, 0x0f, 0x11, opcode::xmm_m64, opcode::xmm));
    return t;
    }